

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_addmul_v_uint64_30_256(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  block_t *in_RDX;
  long in_RSI;
  block_t *in_RDI;
  word mask;
  uint i;
  word idx;
  block_t *Ablock;
  block_t *cblock;
  int local_34;
  ulong local_30;
  block_t *local_28;
  
  local_30 = *(ulong *)(in_RSI + 0x18) >> 0x22;
  local_28 = in_RDX;
  for (local_34 = 0x1e; local_34 != 0; local_34 = local_34 + -1) {
    mzd_xor_mask_uint64_block(in_RDI,local_28,-(local_30 & 1),4);
    local_30 = local_30 >> 1;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_256(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[3] >> 34;
  for (unsigned int i = 30; i; --i, idx >>= 1, ++Ablock) {
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 4);
  }
}